

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall
AbstractModuleClient::unsubscribeFromEvent(AbstractModuleClient *this,string *origin,string *event)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  string *in_RDI;
  MlmWrap *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *in_stack_00000080;
  char *in_stack_00000088;
  MlmWrap *in_stack_00000090;
  key_type *in_stack_ffffffffffffffa8;
  _Self local_30;
  _Self local_28;
  size_type *local_20;
  string *origin_00;
  
  origin_00 = in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(in_RDX,in_stack_ffffffffffffffa8);
  std::__cxx11::string::c_str();
  MlmWrap::removeSubscriptions((MlmWrap *)event,(char *)__range1);
  local_20 = &in_RDI[9]._M_string_length;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffffa8);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x32f96f);
    MlmWrap::subscribeEvent(unaff_retaddr,origin_00,in_RSI);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDX);
  }
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(__s1,"Trodes");
  if (iVar2 == 0) {
    MlmWrap::subscribeStream(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    MlmWrap::subscribeStream(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  return;
}

Assistant:

void AbstractModuleClient::unsubscribeFromEvent(std::string origin, std::string event){
    //remove event
    subbedEvents.erase(event);

    //remove all from origin and resubscribe to subbed events
    removeSubscriptions(origin.c_str());
    for(auto &e : subbedEvents){
        subscribeEvent(origin, e);
    }
    if(streq(origin.c_str(), TRODES_NETWORK_ID)){
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_CMD);
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_NETWORK_NOTIFICATION);
    }
}